

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

Availability __thiscall
miniscript::Node<CPubKey>::Satisfy<WshSatisfier>
          (Node<CPubKey> *this,TapSatisfier *ctx,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *stack,bool nonmalleable)

{
  undefined3 in_register_00000009;
  Availability AVar1;
  long in_FS_OFFSET;
  InputResult ret;
  InputResult local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ProduceInput<WshSatisfier>(&local_70,this,ctx);
  if ((CONCAT31(in_register_00000009,nonmalleable) == 0) ||
     ((AVar1 = NO, local_70.sat.malleable == false && (local_70.sat.has_sig == true)))) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_M_move_assign(stack,&local_70.sat.stack);
    AVar1 = local_70.sat.available;
  }
  miniscript::internal::InputResult::~InputResult(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return AVar1;
  }
  __stack_chk_fail();
}

Assistant:

Availability Satisfy(const Ctx& ctx, std::vector<std::vector<unsigned char>>& stack, bool nonmalleable = true) const {
        auto ret = ProduceInput(ctx);
        if (nonmalleable && (ret.sat.malleable || !ret.sat.has_sig)) return Availability::NO;
        stack = std::move(ret.sat.stack);
        return ret.sat.available;
    }